

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cc
# Opt level: O0

void google::DumpStackTraceAndExit(void)

{
  bool bVar1;
  _union_1457 local_a0;
  sigaction sig_action;
  
  DumpStackTrace(1,DebugWriteToStderr,(void *)0x0);
  bVar1 = glog_internal_namespace_::IsFailureSignalHandlerInstalled();
  if (bVar1) {
    memset(&local_a0,0,0x98);
    sigemptyset((sigset_t *)&sig_action);
    local_a0.sa_handler = (__sighandler_t)0x0;
    sigaction(6,(sigaction *)&local_a0,(sigaction *)0x0);
  }
  abort();
}

Assistant:

static void DumpStackTraceAndExit() {
  DumpStackTrace(1, DebugWriteToStderr, NULL);

  // TODO(hamaji): Use signal instead of sigaction?
  if (IsFailureSignalHandlerInstalled()) {
    // Set the default signal handler for SIGABRT, to avoid invoking our
    // own signal handler installed by InstallFailureSignalHandler().
#ifdef HAVE_SIGACTION
    struct sigaction sig_action;
    memset(&sig_action, 0, sizeof(sig_action));
    sigemptyset(&sig_action.sa_mask);
    sig_action.sa_handler = SIG_DFL;
    sigaction(SIGABRT, &sig_action, NULL);
#elif defined(OS_WINDOWS)
    signal(SIGABRT, SIG_DFL);
#endif  // HAVE_SIGACTION
  }

  abort();
}